

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

void __thiscall
capnp::_::anon_unknown_133::checkEnumList<capnp::DynamicValue::Builder>
          (anon_unknown_133 *this,Builder *reader,initializer_list<const_char_*> expected)

{
  iterator ppcVar1;
  uint index;
  BuilderFor<DynamicEnum> BVar2;
  DynamicEnum e;
  DynamicEnum e_00;
  ArrayPtr<const_char> local_f0;
  Type *local_e0;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  Fault f;
  bool local_70;
  BuilderFor<capnp::DynamicList> list;
  
  ppcVar1 = expected._M_array;
  DynamicValue::Builder::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&list,(Builder *)this);
  _kjCondition.right = list.builder.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = (iterator)(ulong)list.builder.elementCount == ppcVar1;
  _kjCondition.left = (unsigned_long)ppcVar1;
  if (_kjCondition.result) {
    for (index = 0; (iterator)(ulong)index < ppcVar1; index = index + 1) {
      local_e0 = &reader->type + (long)(ulong)index * 2;
      DynamicList::Builder::operator[]((Builder *)&_kjCondition,&list,index);
      BVar2 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                        ((Builder *)&_kjCondition);
      e._8_8_ = BVar2._8_8_;
      e.schema.super_Schema.raw._4_4_ = 0;
      e.schema.super_Schema.raw._0_4_ = BVar2._8_4_;
      local_f0 = (ArrayPtr<const_char>)
                 name((anon_unknown_133 *)BVar2.schema.super_Schema.raw.super_Schema,e);
      kj::_::DebugExpression<char_const*const&>::operator==
                ((DebugComparison<const_char_*const_&,_capnp::Text::Reader> *)&f,
                 (DebugExpression<char_const*const&> *)&local_e0,(Reader *)&local_f0);
      DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
      if ((local_70 == false) && (kj::_::Debug::minSeverity < 3)) {
        DynamicList::Builder::operator[]((Builder *)&_kjCondition,&list,index);
        BVar2 = DynamicValue::Builder::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                          ((Builder *)&_kjCondition);
        e_00._8_8_ = BVar2._8_8_;
        e_00.schema.super_Schema.raw._4_4_ = 0;
        e_00.schema.super_Schema.raw._0_4_ = BVar2._8_4_;
        local_f0 = (ArrayPtr<const_char>)
                   name((anon_unknown_133 *)BVar2.schema.super_Schema.raw.super_Schema,e_00);
        kj::_::Debug::
        log<char_const(&)[85],kj::_::DebugComparison<char_const*const&,capnp::Text::Reader>&,char_const*const&,capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x152,ERROR,
                   "\"failed: expected \" \"(expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))\", _kjCondition, expected.begin()[i], name(list[i].template as<DynamicEnum>())"
                   ,(char (*) [85])
                    "failed: expected (expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))"
                   ,(DebugComparison<const_char_*const_&,_capnp::Text::Reader> *)&f,
                   (char **)(&reader->type + (long)(ulong)index * 2),(Reader *)&local_f0);
        DynamicValue::Builder::~Builder((Builder *)&_kjCondition);
      }
    }
    return;
  }
  local_f0.ptr = (char *)ppcVar1;
  local_e0 = (Type *)CONCAT44(local_e0._4_4_,list.builder.elementCount);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x150,FAILED,"(expected.size()) == (list.size())",
             "_kjCondition,expected.size(), list.size()",&_kjCondition,(unsigned_long *)&local_f0,
             (uint *)&local_e0);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkEnumList(T reader, std::initializer_list<const char*> expected) {
  auto list = reader.as<DynamicList>();
  ASSERT_EQ(expected.size(), list.size());
  for (uint i = 0; i < expected.size(); i++) {
    EXPECT_EQ(expected.begin()[i], name(list[i].as<DynamicEnum>()));
  }
}